

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall testing::internal::MatcherBase<int>::~MatcherBase(MatcherBase<int> *this)

{
  SharedPayloadBase *pSVar1;
  
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00164848;
  if ((this->vtable_ != (VTable *)0x0) &&
     (this->vtable_->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    pSVar1 = (this->buffer_).shared;
    LOCK();
    (pSVar1->ref).super___atomic_base<int>._M_i = (pSVar1->ref).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pSVar1->ref).super___atomic_base<int>._M_i == 0) {
      (*this->vtable_->shared_destroy)((SharedPayloadBase *)(this->buffer_).ptr);
    }
  }
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }